

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testInterval.cpp
# Opt level: O0

void anon_unknown.dwarf_5b268::testMakeInfinite<float>(char *type)

{
  bool bVar1;
  ostream *poVar2;
  char *in_RDI;
  float fVar3;
  Interval<float> b_2;
  float max;
  float min;
  Interval<float> b_1;
  Interval<float> b;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  Interval<float> local_30;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  Interval<float> local_18;
  float local_10;
  float local_c;
  char *local_8;
  
  local_8 = in_RDI;
  poVar2 = std::operator<<((ostream *)&std::cout,"    makeInfinite() for type ");
  poVar2 = std::operator<<(poVar2,local_8);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Interval<float>::Interval((Interval<float> *)0x16bb32);
  Imath_3_2::Interval<float>::makeInfinite
            ((Interval<float> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  fVar3 = std::numeric_limits<float>::lowest();
  bVar1 = false;
  if ((local_10 == fVar3) && (!NAN(local_10) && !NAN(fVar3))) {
    fVar3 = std::numeric_limits<float>::max();
    bVar1 = local_c == fVar3;
  }
  if (!bVar1) {
    __assert_fail("b.min == T (std::numeric_limits<T>::lowest ()) && b.max == T (std::numeric_limits<T>::max ())"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x7f,"void (anonymous namespace)::testMakeInfinite(const char *) [T = float]");
  }
  local_1c = -1.0;
  local_20 = 1.0;
  Imath_3_2::Interval<float>::Interval(&local_18,&local_1c,&local_20);
  Imath_3_2::Interval<float>::makeInfinite
            ((Interval<float> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  fVar3 = std::numeric_limits<float>::lowest();
  bVar1 = false;
  if ((local_18.min == fVar3) && (!NAN(local_18.min) && !NAN(fVar3))) {
    fVar3 = std::numeric_limits<float>::max();
    bVar1 = local_18.max == fVar3;
  }
  if (!bVar1) {
    __assert_fail("b.min == T (std::numeric_limits<T>::lowest ()) && b.max == T (std::numeric_limits<T>::max ())"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x8a,"void (anonymous namespace)::testMakeInfinite(const char *) [T = float]");
  }
  local_24 = 0.0;
  local_28 = 1.0;
  Imath_3_2::Interval<float>::Interval(&local_30,&local_24,&local_28);
  Imath_3_2::Interval<float>::makeInfinite
            ((Interval<float> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  fVar3 = std::numeric_limits<float>::lowest();
  bVar1 = false;
  if ((local_30.min == fVar3) && (!NAN(local_30.min) && !NAN(fVar3))) {
    fVar3 = std::numeric_limits<float>::max();
    bVar1 = local_30.max == fVar3;
  }
  if (!bVar1) {
    __assert_fail("b.min == T (std::numeric_limits<T>::lowest ()) && b.max == T (std::numeric_limits<T>::max ())"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x98,"void (anonymous namespace)::testMakeInfinite(const char *) [T = float]");
  }
  return;
}

Assistant:

void
testMakeInfinite (const char* type)
{
    cout << "    makeInfinite() for type " << type << endl;

    //
    // Infinite interval
    //
    {
        IMATH_INTERNAL_NAMESPACE::Interval<T> b;
        b.makeInfinite ();
        assert (
            b.min == T (std::numeric_limits<T>::lowest ()) &&
            b.max == T (std::numeric_limits<T>::max ()));
    }

    //
    // Non-empty, has volume
    //
    {
        IMATH_INTERNAL_NAMESPACE::Interval<T> b (T (-1), T (1));
        b.makeInfinite ();
        assert (
            b.min == T (std::numeric_limits<T>::lowest ()) &&
            b.max == T (std::numeric_limits<T>::max ()));
    }

    //
    // Non-empty, no volume
    //
    {
        T min (0);
        T max (1);

        IMATH_INTERNAL_NAMESPACE::Interval<T> b (min, max);
        b.makeInfinite ();
        assert (
            b.min == T (std::numeric_limits<T>::lowest ()) &&
            b.max == T (std::numeric_limits<T>::max ()));
    }
}